

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O3

shared_ptr<kratos::Stmt> __thiscall
kratos::Generator::wire_ports
          (Generator *this,shared_ptr<kratos::Port> *port1,shared_ptr<kratos::Port> *port2)

{
  size_type *psVar1;
  element_type *var;
  shared_ptr<kratos::Var> *var_00;
  undefined8 uVar2;
  undefined8 uVar3;
  pair<bool,_bool> pVar4;
  VarException *this_00;
  undefined8 *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<kratos::Stmt> sVar6;
  string_view format_str;
  format_args args;
  initializer_list<const_kratos::IRNode_*> __l;
  element_type *local_d8;
  undefined8 local_d0;
  pointer local_c8;
  pointer ppStack_c0;
  pointer local_a8;
  pointer ppStack_a0;
  shared_ptr<kratos::Stmt> local_88;
  undefined1 local_78 [80];
  
  pVar4 = correct_port_direction
                    ((port2->super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                     (Port *)*in_RCX,(Generator *)port1);
  if (((ushort)pVar4 >> 8 & 1) != 0) {
    if (((ushort)pVar4 & 1) == 0) {
      var_00 = (shared_ptr<kratos::Var> *)*in_RCX;
      local_78._40_8_ = (port2->super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      local_78._48_8_ =
           (port2->super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._48_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._48_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._48_8_)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._48_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._48_8_)->_M_use_count + 1;
        }
      }
      Var::assign((Var *)local_78,var_00);
    }
    else {
      var = (port2->super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_78._40_8_ = *in_RCX;
      local_78._48_8_ = in_RCX[1];
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._48_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._48_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._48_8_)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._48_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._48_8_)->_M_use_count + 1;
        }
      }
      Var::assign((Var *)local_78,(shared_ptr<kratos::Var> *)var);
    }
    uVar3 = local_78._8_8_;
    uVar2 = local_78._0_8_;
    local_78._0_8_ = (pointer)0x0;
    local_78._8_8_ = (pointer)0x0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._48_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._48_8_);
    }
    local_88.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)uVar2;
    local_88.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
    if ((pointer)uVar3 != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        psVar1 = &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar3)->
                  _M_string_length;
        *(int *)psVar1 = (int)*psVar1 + 1;
        UNLOCK();
      }
      else {
        psVar1 = &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar3)->
                  _M_string_length;
        *(int *)psVar1 = (int)*psVar1 + 1;
      }
    }
    (*((IRNode *)uVar2)->_vptr_IRNode[7])(uVar2,port1);
    std::vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>::
    emplace_back<std::shared_ptr<kratos::Stmt>>
              ((vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>
                *)&port1[0x1f].super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount,&local_88);
    _Var5._M_pi = extraout_RDX;
    if ((pointer)local_88.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_88.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
      _Var5._M_pi = extraout_RDX_00;
    }
    (this->super_IRNode)._vptr_IRNode = (_func_int **)uVar2;
    (this->super_IRNode).fn_name_ln.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)uVar3;
    sVar6.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var5._M_pi;
    sVar6.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
    ;
    return (shared_ptr<kratos::Stmt>)
           sVar6.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (VarException *)__cxa_allocate_exception(0x10);
  (*(((port2->super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->super_Var).
    super_IRNode._vptr_IRNode[0x1f])(&local_a8);
  (**(code **)(*(long *)*in_RCX + 0xf8))(&local_c8);
  local_78._0_8_ = local_a8;
  local_78._8_8_ = ppStack_a0;
  local_78._16_8_ = local_c8;
  local_78._24_8_ = ppStack_c0;
  format_str.size_ = 0xdd;
  format_str.data_ = (char *)0x52;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_78;
  fmt::v7::detail::vformat_abi_cxx11_
            ((string *)(local_78 + 0x28),
             (detail *)
             "Cannot wire {0} and {1}. Please make sure they belong to the same module or parent",
             format_str,args);
  local_d8 = (port2->super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_d0 = *in_RCX;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_d8;
  std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
            ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)local_78,__l
             ,(allocator_type *)(local_78 + 0x4f));
  VarException::VarException
            (this_00,(string *)(local_78 + 0x28),
             (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)local_78);
  __cxa_throw(this_00,&VarException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::shared_ptr<Stmt> Generator::wire_ports(std::shared_ptr<Port> &port1,
                                            std::shared_ptr<Port> &port2) {
    auto [dir, no_error] = correct_port_direction(port1.get(), port2.get(), this);
    if (!no_error) {
        throw VarException(
            ::format("Cannot wire {0} and {1}. Please make sure they belong to the same module "
                     "or parent",
                     port1->to_string(), port2->to_string()),
            {port1.get(), port2.get()});
    }
    std::shared_ptr<AssignStmt> stmt;
    if (dir)
        stmt = port1->assign(port2);
    else
        stmt = port2->assign(port1);
    add_stmt(stmt);
    return stmt;
}